

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O2

void __thiscall ZlibWriter::ZlibWriter(ZlibWriter *this)

{
  int in_ESI;
  
  this->_vptr_ZlibWriter = (_func_int **)&PTR__ZlibWriter_0010ad88;
  (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->zbuf_changed = false;
  reset_zlib(this,in_ESI);
  return;
}

Assistant:

ZlibWriter::ZlibWriter() :
	zbuf_changed(false)
{
	reset_zlib(Z_DEFAULT_COMPRESSION);
}